

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Arena.cpp
# Opt level: O1

bool __thiscall amrex::Arena::isPinned(Arena *this)

{
  return false;
}

Assistant:

bool
Arena::isPinned () const
{
#ifdef AMREX_USE_GPU
    return (! arena_info.use_cpu_memory)
        &&    arena_info.device_use_hostalloc;
#else
    return false;
#endif
}